

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.cpp
# Opt level: O0

void * SeanetThread(void *pParam)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  tm *ptVar4;
  timeval *ptVar5;
  int byte;
  int Bearing;
  char SOf [4];
  double Seconds;
  int Min;
  int Hour;
  tm *timeptr;
  time_t tt;
  char szTemp [256];
  char szSaveFilePath [256];
  int local_f30;
  int i;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  double dStack_ed8;
  BOOL bConnected;
  double distance;
  uchar local_ec8 [4];
  int nbauxbytes;
  uchar auxbuf [128];
  uchar scanline [2048];
  double local_640;
  double angle;
  timeval tv;
  SEANET seanet;
  void *pParam_local;
  
  local_640 = 0.0;
  distance._4_4_ = 0;
  dStack_ed8 = 0.0;
  chrono_period._68_4_ = 0;
  i = 100;
  local_f30 = 0;
  seanet._1512_8_ = pParam;
  memset(&tv.tv_usec,0,0x5f0);
  memset(&angle,0,0x10);
  local_640 = 0.0;
  memset(auxbuf + 0x78,0,0x800);
  memset(local_ec8,0,0x80);
  distance._4_4_ = 0;
  StartChrono((CHRONO *)&errcount);
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      if (bPauseSeanet == 0) break;
      if (chrono_period._68_4_ != 0) {
        printf("Seanet paused.\n");
        chrono_period._68_4_ = 0;
        DisconnectSeanetEx((SEANET *)&tv.tv_usec);
      }
      if (bExit != 0) goto LAB_001afcd4;
      mSleep(100);
    }
    if (bRestartSeanet != 0) {
      if (chrono_period._68_4_ != 0) {
        printf("Restarting a Seanet.\n");
        chrono_period._68_4_ = 0;
        DisconnectSeanetEx((SEANET *)&tv.tv_usec);
      }
      bRestartSeanet = 0;
    }
    if (chrono_period._68_4_ == 0) {
      iVar1 = ConnectSeanetEx((SEANET *)&tv.tv_usec,"Seanet0.txt");
      if (iVar1 == 0) {
        chrono_period._68_4_ = 1;
        i = seanet.BaudRate;
        memset(&angle,0,0x10);
        local_640 = 0.0;
        memset(auxbuf + 0x78,0,0x800);
        memset(local_ec8,0,0x80);
        distance._4_4_ = 0;
        EnterCriticalSection(&SeanetConnectingCS);
        AdLow = seanet.LeftLim;
        AdSpan = seanet.RightLim;
        Steps = seanet.IGain;
        NSteps = seanet.Slope;
        Hdctrl.i = seanet.bDST;
        StepAngleSize = (double)seanet._1456_8_;
        NBins = seanet.StepAngleSize._0_4_;
        alpha_max_err = (double)seanet._1488_8_;
        d_max_err = seanet.alpha_max_err;
        rangescale = seanet.threadperiod;
        index_scanlines_prev = 0;
        index_scanlines = 0;
        free(tvs);
        free(angles);
        free(scanlines);
        tvs = (timeval *)0x0;
        angles = (double *)0x0;
        scanlines = (uchar *)0x0;
        tvs = (timeval *)calloc((long)seanet.Slope,0x10);
        angles = (double *)calloc((long)seanet.Slope,8);
        scanlines = (uchar *)calloc((long)(seanet.Slope << 0xb),1);
        if (((tvs == (timeval *)0x0) || (angles == (double *)0x0)) || (scanlines == (uchar *)0x0)) {
          printf("Unable to allocate Seanet data.\n");
          LeaveCriticalSection(&SeanetConnectingCS);
          break;
        }
        LeaveCriticalSection(&SeanetConnectingCS);
        if (seanet._896_8_ != 0) {
          fclose((FILE *)seanet._896_8_);
          seanet.HeadInf = 0;
          seanet._900_4_ = 0;
        }
        if ((seanet.timeout != 0) && (seanet._896_8_ == 0)) {
          sVar2 = strlen((char *)&seanet.pfSaveFile);
          if (sVar2 == 0) {
            sprintf((char *)&tt,"seanet");
          }
          else {
            sprintf((char *)&tt,"%.127s",&seanet.pfSaveFile);
          }
          sVar2 = strlen((char *)&tt);
          szSaveFilePath._252_4_ = (undefined4)sVar2;
          do {
            szSaveFilePath._252_4_ = szSaveFilePath._252_4_ + -1;
            if ((int)szSaveFilePath._252_4_ < 0) break;
          } while (szTemp[(long)(int)szSaveFilePath._252_4_ + -8] != '.');
          if ((0 < (int)szSaveFilePath._252_4_) &&
             (sVar2 = strlen((char *)&tt), (int)szSaveFilePath._252_4_ < (int)sVar2)) {
            sVar2 = strlen((char *)&tt);
            memset(szTemp + (long)(int)szSaveFilePath._252_4_ + -8,0,
                   sVar2 - (long)(int)szSaveFilePath._252_4_);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar3 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.csv",&tt,pcVar3);
          LeaveCriticalSection(&strtimeCS);
          seanet._896_8_ = fopen(szTemp + 0xf8,"w");
          if ((FILE *)seanet._896_8_ == (FILE *)0x0) {
            printf("Unable to create Seanet data file.\n");
            break;
          }
          fprintf((FILE *)seanet._896_8_,
                  "SOf,DateTime,Node,Status,Hdctrl,Rangescale,Gain,Slope,AdLow,AdSpan,LeftLim,RightLim,Steps,Bearing,Dbytes,Dbytes of DATA\n"
                 );
          fflush((FILE *)seanet._896_8_);
        }
      }
      else {
        chrono_period._68_4_ = 0;
        mSleep(1000);
      }
    }
    else {
      distance._4_4_ = 0;
      iVar1 = GetHeadDataAndAuxDataSeanetEx
                        ((SEANET *)&tv.tv_usec,auxbuf + 0x78,&local_640,local_ec8,
                         (int *)((long)&distance + 4));
      if (iVar1 == 0) {
        timeptr = (tm *)0x0;
        Seconds._4_4_ = 0;
        Seconds._0_4_ = 0;
        _Bearing = 0.0;
        iVar1 = gettimeofday((timeval *)&angle,(__timezone_ptr_t)0x0);
        if (iVar1 != 0) {
          angle = 0.0;
          tv.tv_sec = 0;
        }
        timeptr = (tm *)angle;
        ptVar4 = localtime((time_t *)&timeptr);
        if (ptVar4 != (tm *)0x0) {
          Seconds._4_4_ = ptVar4->tm_hour;
          Seconds._0_4_ = ptVar4->tm_min;
          _Bearing = (double)tv.tv_sec * 1e-06 + (double)ptVar4->tm_sec;
        }
        if (0 < distance._4_4_) {
          iVar1 = __isoc99_sscanf(local_ec8,"%lfm\r",&stack0xfffffffffffff128);
          if (iVar1 == 1) {
            EnterCriticalSection(&StateVariablesCS);
            altitude_AGL = dStack_ed8;
            LeaveCriticalSection(&StateVariablesCS);
          }
          if (seanet.timeout != 0) {
            fprintf((FILE *)seanet._896_8_,"%02d:%02d:%06.3f,%.100s\n",_Bearing,(ulong)Seconds._4_4_
                    ,(ulong)Seconds._0_4_,local_ec8);
          }
        }
        EnterCriticalSection(&SeanetDataCS);
        ptVar5 = tvs + index_scanlines;
        ptVar5->tv_sec = (__time_t)angle;
        ptVar5->tv_usec = tv.tv_sec;
        angles[index_scanlines] = local_640;
        memcpy(scanlines + index_scanlines * seanet.StepAngleSize._0_4_,auxbuf + 0x78,
               (long)seanet.StepAngleSize._0_4_);
        index_scanlines = (index_scanlines + 1) % seanet.Slope;
        LeaveCriticalSection(&SeanetDataCS);
        if (seanet.timeout != 0) {
          if (seanet.RS232Port.DevType == 0) {
            strcpy((char *)&byte,"SON");
          }
          else {
            strcpy((char *)&byte,"DIG");
          }
          fprintf((FILE *)seanet._896_8_,
                  "%.3s,%02d:%02d:%06.3f,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d",_Bearing,&byte,
                  (ulong)Seconds._4_4_,(ulong)Seconds._0_4_,2,seanet.Resolution,seanet.NSteps,
                  seanet.HeadStatus,seanet.HeadHdCtrl.u,seanet.HeadRangescale,seanet.HeadIGain,
                  seanet.HeadSlope,seanet.HeadADSpan,seanet.HeadADInterval,seanet.HeadLeftLim,
                  (int)(local_640 / 0.05625 + 3200.0 + 6400.0) % 0x1900,seanet.HeadSteps);
          if (seanet.StepAngleSize._4_4_ == 0) {
            szSaveFilePath[0xfc] = '\0';
            szSaveFilePath[0xfd] = '\0';
            szSaveFilePath[0xfe] = '\0';
            szSaveFilePath[0xff] = '\0';
            for (; (int)szSaveFilePath._252_4_ < seanet.HeadSteps;
                szSaveFilePath._252_4_ = szSaveFilePath._252_4_ + 1) {
              fprintf((FILE *)seanet._896_8_,",%d",
                      (ulong)((auxbuf[(long)(int)(szSaveFilePath._252_4_ << 1) + 0x78] / 0x10) *
                              0x10 + auxbuf[(long)(szSaveFilePath._252_4_ * 2 + 1) + 0x78] / 0x10));
            }
          }
          else {
            szSaveFilePath[0xfc] = '\0';
            szSaveFilePath[0xfd] = '\0';
            szSaveFilePath[0xfe] = '\0';
            szSaveFilePath[0xff] = '\0';
            for (; (int)szSaveFilePath._252_4_ < seanet.HeadSteps;
                szSaveFilePath._252_4_ = szSaveFilePath._252_4_ + 1) {
              fprintf((FILE *)seanet._896_8_,",%d",
                      (ulong)auxbuf[(long)(int)szSaveFilePath._252_4_ + 0x78]);
            }
          }
          fprintf((FILE *)seanet._896_8_,"\n");
          fflush((FILE *)seanet._896_8_);
        }
      }
      else {
        printf("Connection to a Seanet lost.\n");
        chrono_period._68_4_ = 0;
        DisconnectSeanetEx((SEANET *)&tv.tv_usec);
        mSleep((long)i);
      }
    }
    if (((chrono_period._68_4_ == 0) && (local_f30 = local_f30 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_f30)) {
      bExit = 1;
    }
  } while (bExit == 0);
LAB_001afcd4:
  StopChronoQuick((CHRONO *)&errcount);
  if (seanet._896_8_ != 0) {
    fclose((FILE *)seanet._896_8_);
    seanet.HeadInf = 0;
    seanet._900_4_ = 0;
  }
  EnterCriticalSection(&SeanetConnectingCS);
  free(scanlines);
  scanlines = (uchar *)0x0;
  free(angles);
  angles = (double *)0x0;
  free(tvs);
  tvs = (timeval *)0x0;
  LeaveCriticalSection(&SeanetConnectingCS);
  if (chrono_period._68_4_ != 0) {
    DisconnectSeanetEx((SEANET *)&tv.tv_usec);
  }
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SeanetThread(void* pParam)
{
	SEANET seanet;
	//SEANETDATA seanetdata;
	struct timeval tv;
	double angle = 0;
	unsigned char scanline[MAX_NB_BYTES_SEANET];
	unsigned char auxbuf[128]; // For daisy-chained device.
	int nbauxbytes = 0; // For daisy-chained device.
	double distance = 0; // For daisy-chained echosounder.
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&seanet, 0, sizeof(SEANET));

	memset(&tv, 0, sizeof(tv));
	angle = 0;
	memset(scanline, 0, sizeof(scanline));
	memset(auxbuf, 0, sizeof(auxbuf));
	nbauxbytes = 0;

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		//mSleep(threadperiod);

		if (bPauseSeanet) 
		{
			if (bConnected)
			{
				printf("Seanet paused.\n");
				bConnected = FALSE;
				DisconnectSeanetEx(&seanet);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartSeanet) 
		{
			if (bConnected)
			{
				printf("Restarting a Seanet.\n");
				bConnected = FALSE;
				DisconnectSeanetEx(&seanet);
			}
			bRestartSeanet = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectSeanetEx(&seanet, "Seanet0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = seanet.threadperiod;

				memset(&tv, 0, sizeof(tv));
				angle = 0;
				memset(scanline, 0, sizeof(scanline));
				memset(auxbuf, 0, sizeof(auxbuf));
				nbauxbytes = 0;

				EnterCriticalSection(&SeanetConnectingCS);

				AdLow = seanet.ADLow;
				AdSpan = seanet.ADSpan;
				Steps = seanet.Resolution;
				NSteps = seanet.NSteps;
				Hdctrl = seanet.HdCtrl;
				StepAngleSize = seanet.StepAngleSize;
				NBins = seanet.NBins;

				alpha_max_err = seanet.alpha_max_err;
				d_max_err = seanet.d_max_err;
				rangescale = seanet.RangeScale;

				index_scanlines_prev = 0;
				index_scanlines = 0;

				free(tvs); free(angles); free(scanlines);
				tvs = NULL; angles = NULL; scanlines = NULL;
				tvs = (struct timeval*)calloc(seanet.NSteps, sizeof(struct timeval));
				angles = (double*)calloc(seanet.NSteps, sizeof(double));
				scanlines = (unsigned char*)calloc(seanet.NSteps*MAX_NB_BYTES_SEANET, sizeof(unsigned char));
				if ((tvs == NULL)||(angles == NULL)||(scanlines == NULL))
				{
					printf("Unable to allocate Seanet data.\n");
					LeaveCriticalSection(&SeanetConnectingCS);
					break;
				}

				LeaveCriticalSection(&SeanetConnectingCS);

				if (seanet.pfSaveFile != NULL)
				{
					fclose(seanet.pfSaveFile); 
					seanet.pfSaveFile = NULL;
				}
				if ((seanet.bSaveRawData)&&(seanet.pfSaveFile == NULL)) 
				{
					if (strlen(seanet.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", seanet.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "seanet");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					seanet.pfSaveFile = fopen(szSaveFilePath, "w");
					if (seanet.pfSaveFile == NULL) 
					{
						printf("Unable to create Seanet data file.\n");
						break;
					}
					fprintf(seanet.pfSaveFile, 
						"SOf,DateTime,Node,Status,Hdctrl,Rangescale,Gain,Slope,AdLow,AdSpan,LeftLim,RightLim,Steps,Bearing,Dbytes,Dbytes of DATA\n"
						); 
					fflush(seanet.pfSaveFile);
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			nbauxbytes = 0;
			// Swap commented line to enable/disable Aux device support...
			//if (GetHeadDataSeanetEx(&seanet, scanline, &angle) == EXIT_SUCCESS)
			if (GetHeadDataAndAuxDataSeanetEx(&seanet, scanline, &angle, auxbuf, &nbauxbytes) == EXIT_SUCCESS)
			{
				time_t tt = 0;
				struct tm* timeptr = NULL;
				int Hour = 0, Min = 0;
				double Seconds = 0;

				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				tt = tv.tv_sec;
				timeptr = localtime(&tt);
				if (timeptr != NULL)
				{
					Hour = timeptr->tm_hour;
					Min = timeptr->tm_min;
					Seconds = timeptr->tm_sec+0.000001*tv.tv_usec;
				}

				if (nbauxbytes > 0)
				{
					// Echosounder.
					if (sscanf((char*)auxbuf, "%lfm\r", &distance) == 1)
					{
						EnterCriticalSection(&StateVariablesCS);

						altitude_AGL = distance;

						LeaveCriticalSection(&StateVariablesCS);
					}

					if (seanet.bSaveRawData)
					{
						// Should remove the final LF from auxbuf (maybe in HeadDataReplyAndAuxDataSeanet()...) 
						// and end-of-line characters might be inconsistent with Seanet log files (especially on Linux)... 

						fprintf(seanet.pfSaveFile, "%02d:%02d:%06.3f,%.100s\n", Hour, Min, Seconds, (char*)auxbuf);
					}
				}

				EnterCriticalSection(&SeanetDataCS);

				tvs[index_scanlines] = tv;
				angles[index_scanlines] = angle;
				memcpy(scanlines+index_scanlines*seanet.NBins, scanline, seanet.NBins);
				index_scanlines++;
				index_scanlines = index_scanlines%seanet.NSteps;

				//// For direct waterfall display...
				//memmove(tvs+1, tvs, (seanet.NSteps-1)*sizeof(struct timeval));
				//tvs[0] = tv;
				//memmove(angles+1, angles, (seanet.NSteps-1)*sizeof(double));
				//angles[0] = angle;
				//memmove(scanlines+seanet.NBins, scanlines, (seanet.NSteps-1)*seanet.NBins);
				//memcpy(scanlines, scanline, seanet.NBins);

				LeaveCriticalSection(&SeanetDataCS);

				if (seanet.bSaveRawData)
				{
					char SOf[3+1];
					int Bearing = 0;

					if (seanet.bDST) strcpy(SOf, "DIG"); else strcpy(SOf, "SON");

					Bearing = ((int)(angle/0.05625+3200+6400))%6400; // Angle of the transducer (0..6399 in 1/16 Gradian units, 0.05625 = (1/16)*(9/10)).

					fprintf(seanet.pfSaveFile, "%.3s,%02d:%02d:%06.3f,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d", 
						SOf, Hour, Min, Seconds, SERIAL_PORT_SONAR_NODE_NUMBER_SEANET, 
						seanet.HeadStatus, seanet.HeadHdCtrl.i, seanet.HeadRangescale, seanet.HeadIGain, 
						seanet.HeadSlope, seanet.HeadADLow, seanet.HeadADSpan, seanet.HeadLeftLim, seanet.HeadRightLim, 
						seanet.HeadSteps, Bearing, seanet.Dbytes
						);

					// We should take into account ADLow and ADSpan here?

					if (!seanet.adc8on)	
					{ 
						for (i = 0; i < seanet.Dbytes; i++)
						{
							int byte = ((scanline[2*i]/16)<<4)+scanline[2*i+1]/16;
							fprintf(seanet.pfSaveFile, ",%d", byte);
						}
					}
					else
					{ 
						for (i = 0; i < seanet.Dbytes; i++)
						{
							fprintf(seanet.pfSaveFile, ",%d", (int)scanline[i]);
						}
					}

					fprintf(seanet.pfSaveFile, "\n");

					fflush(seanet.pfSaveFile);
				}
			}
			else
			{
				printf("Connection to a Seanet lost.\n");
				bConnected = FALSE;
				DisconnectSeanetEx(&seanet);
				mSleep(threadperiod);
			}
		}

		//printf("SeanetThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (seanet.pfSaveFile != NULL)
	{
		fclose(seanet.pfSaveFile); 
		seanet.pfSaveFile = NULL;
	}

	EnterCriticalSection(&SeanetConnectingCS);
	free(scanlines);
	scanlines = NULL;
	free(angles);
	angles = NULL;
	free(tvs);
	tvs = NULL;
	LeaveCriticalSection(&SeanetConnectingCS);

	if (bConnected) DisconnectSeanetEx(&seanet);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}